

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BayesianGameWithClusterInfo.cpp
# Opt level: O1

void __thiscall
BayesianGameWithClusterInfo::BayesianGameWithClusterInfo
          (BayesianGameWithClusterInfo *this,BayesianGameWithClusterInfo *o)

{
  QHybrid *pQVar1;
  double dVar2;
  vector<TypeCluster_*,_std::allocator<TypeCluster_*>_> *pvVar3;
  TypeCluster *this_00;
  long lVar4;
  ulong uVar5;
  pointer ppvVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  undefined1 auVar10 [64];
  allocator_type local_69;
  BayesianGameWithClusterInfo *local_68;
  vector<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*,_std::allocator<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*>_>
  *local_60;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_58;
  value_type local_50;
  vector<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*,_std::allocator<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*>_>
  local_48;
  
  BayesianGameForDecPOMDPStage::BayesianGameForDecPOMDPStage
            (&this->super_BayesianGameForDecPOMDPStage,&o->super_BayesianGameForDecPOMDPStage);
  (this->super_BayesianGameForDecPOMDPStage).super_BayesianGameForDecPOMDPStageInterface.
  _vptr_BayesianGameForDecPOMDPStageInterface =
       (_func_int **)&PTR__BayesianGameWithClusterInfo_005a1720;
  (this->super_BayesianGameForDecPOMDPStage).super_BayesianGameIdenticalPayoff.
  super_BayesianGameIdenticalPayoffInterface.super_BayesianGameBase.
  super_Interface_ProblemToPolicyDiscretePure.super_Interface_ProblemToPolicyDiscrete.
  _vptr_Interface_ProblemToPolicyDiscrete = (_func_int **)&PTR__BayesianGameWithClusterInfo_005a1770
  ;
  (this->_m_pBG).px = (element_type *)0x0;
  (this->_m_pBG).pn.pi_ = (sp_counted_base *)0x0;
  local_60 = &this->_m_typeLists;
  auVar10 = ZEXT464(0) << 0x40;
  (this->_m_pBGJPol).px = (element_type *)SUB168(auVar10._0_16_,0);
  (this->_m_pBGJPol).pn = (shared_count)SUB168(auVar10._0_16_,8);
  this->_m_jaohReps = (vector<unsigned_int,_std::allocator<unsigned_int>_>)auVar10._16_24_;
  this->_m_typeLists =
       (vector<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*,_std::allocator<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*>_>
        )auVar10._40_24_;
  boost::shared_ptr<const_BayesianGameWithClusterInfo>::operator=(&this->_m_pBG,&o->_m_pBG);
  pQVar1 = o->_m_qHybrid;
  this->_m_qJB = o->_m_qJB;
  this->_m_qHybrid = pQVar1;
  boost::shared_ptr<const_JointPolicyDiscretePure>::operator=(&this->_m_pBGJPol,&o->_m_pBGJPol);
  local_68 = this;
  local_58 = &this->_m_jaohReps;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
            (&this->_m_jaohReps,&o->_m_jaohReps);
  this->_m_clusterAlgorithm = o->_m_clusterAlgorithm;
  dVar2 = o->_m_thresholdPjaoh;
  this->_m_thresholdJB = o->_m_thresholdJB;
  this->_m_thresholdPjaoh = dVar2;
  local_50 = (value_type)0x0;
  std::
  vector<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*,_std::allocator<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*>_>
  ::vector(&local_48,
           (long)(o->_m_typeLists).
                 super__Vector_base<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*,_std::allocator<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)(o->_m_typeLists).
                 super__Vector_base<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*,_std::allocator<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*>_>
                 ._M_impl.super__Vector_impl_data._M_start >> 3,&local_50,&local_69);
  std::
  vector<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*,_std::allocator<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*>_>
  ::_M_move_assign(local_60,&local_48);
  if (local_48.
      super__Vector_base<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*,_std::allocator<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.
                    super__Vector_base<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*,_std::allocator<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_48.
                          super__Vector_base<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*,_std::allocator<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.
                          super__Vector_base<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*,_std::allocator<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  ppvVar6 = (o->_m_typeLists).
            super__Vector_base<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*,_std::allocator<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  lVar4 = (long)(o->_m_typeLists).
                super__Vector_base<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*,_std::allocator<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*>_>
                ._M_impl.super__Vector_impl_data._M_finish - (long)ppvVar6;
  if (lVar4 != 0) {
    uVar5 = lVar4 >> 3;
    uVar8 = 0;
    do {
      if (uVar5 <= uVar8) {
LAB_0037cb11:
        std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar8
                  );
      }
      if (ppvVar6[uVar8] != (vector<TypeCluster_*,_std::allocator<TypeCluster_*>_> *)0x0) {
        pvVar3 = (vector<TypeCluster_*,_std::allocator<TypeCluster_*>_> *)operator_new(0x18);
        std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>::vector(pvVar3,ppvVar6[uVar8]);
        ppvVar6 = (local_68->_m_typeLists).
                  super__Vector_base<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*,_std::allocator<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        if ((ulong)((long)(local_68->_m_typeLists).
                          super__Vector_base<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*,_std::allocator<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*>_>
                          ._M_impl.super__Vector_impl_data._M_finish - (long)ppvVar6 >> 3) <= uVar8)
        goto LAB_0037cb11;
        ppvVar6[uVar8] = pvVar3;
        ppvVar6 = (o->_m_typeLists).
                  super__Vector_base<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*,_std::allocator<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        uVar5 = uVar8;
        if ((ulong)((long)(o->_m_typeLists).
                          super__Vector_base<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*,_std::allocator<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*>_>
                          ._M_impl.super__Vector_impl_data._M_finish - (long)ppvVar6 >> 3) <= uVar8)
        {
LAB_0037cb00:
          std::__throw_out_of_range_fmt
                    ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                     uVar5);
        }
        uVar7 = 0;
        uVar9 = 1;
        while ((long)*(pointer *)
                      ((long)&(ppvVar6[uVar8]->
                              super__Vector_base<TypeCluster_*,_std::allocator<TypeCluster_*>_>).
                              _M_impl.super__Vector_impl_data + 8) -
               *(long *)&(ppvVar6[uVar8]->
                         super__Vector_base<TypeCluster_*,_std::allocator<TypeCluster_*>_>)._M_impl.
                         super__Vector_impl_data >> 3 != uVar7) {
          this_00 = (TypeCluster *)operator_new(0x38);
          lVar4 = *(long *)&(ppvVar6[uVar8]->
                            super__Vector_base<TypeCluster_*,_std::allocator<TypeCluster_*>_>).
                            _M_impl.super__Vector_impl_data;
          if ((ulong)((long)*(pointer *)
                             ((long)&(ppvVar6[uVar8]->
                                     super__Vector_base<TypeCluster_*,_std::allocator<TypeCluster_*>_>
                                     )._M_impl.super__Vector_impl_data + 8) - lVar4 >> 3) <= uVar7)
          {
            std::__throw_out_of_range_fmt
                      ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                       uVar7);
          }
          TypeCluster::TypeCluster(this_00,*(TypeCluster **)(lVar4 + uVar7 * 8));
          ppvVar6 = (local_68->_m_typeLists).
                    super__Vector_base<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*,_std::allocator<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          uVar5 = uVar8;
          if (((ulong)((long)(local_68->_m_typeLists).
                             super__Vector_base<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*,_std::allocator<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)ppvVar6 >> 3) <=
               uVar8) ||
             (pvVar3 = ppvVar6[uVar8],
             lVar4 = *(long *)&(pvVar3->
                               super__Vector_base<TypeCluster_*,_std::allocator<TypeCluster_*>_>).
                               _M_impl.super__Vector_impl_data, uVar5 = uVar7,
             (ulong)((long)*(pointer *)
                            ((long)&(pvVar3->
                                    super__Vector_base<TypeCluster_*,_std::allocator<TypeCluster_*>_>
                                    )._M_impl.super__Vector_impl_data + 8) - lVar4 >> 3) <= uVar7))
          goto LAB_0037cb00;
          *(TypeCluster **)(lVar4 + uVar7 * 8) = this_00;
          ppvVar6 = (o->_m_typeLists).
                    super__Vector_base<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*,_std::allocator<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          uVar7 = uVar9;
          uVar5 = uVar8;
          uVar9 = (ulong)((int)uVar9 + 1);
          if ((ulong)((long)(o->_m_typeLists).
                            super__Vector_base<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*,_std::allocator<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)ppvVar6 >> 3) <=
              uVar8) goto LAB_0037cb00;
        }
      }
      uVar8 = (ulong)((int)uVar8 + 1);
      ppvVar6 = (o->_m_typeLists).
                super__Vector_base<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*,_std::allocator<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      uVar5 = (long)(o->_m_typeLists).
                    super__Vector_base<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*,_std::allocator<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish - (long)ppvVar6 >> 3;
    } while (uVar5 != uVar8);
  }
  return;
}

Assistant:

BayesianGameWithClusterInfo::BayesianGameWithClusterInfo(const BayesianGameWithClusterInfo& o) :
        BayesianGameForDecPOMDPStage( o )
{
    _m_pBG = o._m_pBG;
    _m_qJB = o._m_qJB;
    _m_qHybrid = o._m_qHybrid;
    _m_pBGJPol = o._m_pBGJPol;
    _m_jaohReps = o._m_jaohReps;
    _m_clusterAlgorithm = o._m_clusterAlgorithm;
    _m_thresholdJB = o._m_thresholdJB;
    _m_thresholdPjaoh = o._m_thresholdPjaoh;
    _m_typeLists= std::vector< TypeClusterList* > (o._m_typeLists.size(),0);
    for(Index k=0;k!=o._m_typeLists.size();++k)
    {
        if(o._m_typeLists.at(k))
        {
            _m_typeLists.at(k)=new TypeClusterList(*o._m_typeLists.at(k));
            for(Index j=0;j!=o._m_typeLists.at(k)->size();++j)
                _m_typeLists.at(k)->at(j)=new TypeCluster(*o._m_typeLists.at(k)->at(j));
        }
    }
}